

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_short>,_ImPlot::TransformerLogLog>::operator()
          (RectRenderer<ImPlot::GetterHeatmap<unsigned_short>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  uint uVar1;
  ImDrawVert *pIVar2;
  ImDrawIdx *pIVar3;
  undefined1 auVar4 [16];
  ImVec2 IVar5;
  ImVec2 IVar6;
  bool bVar7;
  ImDrawIdx IVar8;
  float fVar9;
  float fVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  RectInfo rect;
  RectInfo local_60;
  ImRect local_38;
  
  GetterHeatmap<unsigned_short>::operator()(&local_60,this->Getter,prim);
  IVar5 = TransformerLogLog::operator()(this->Transformer,&local_60.Min);
  auVar13._8_4_ = extraout_XMM0_Dc;
  auVar13._0_4_ = IVar5.x;
  auVar13._4_4_ = IVar5.y;
  auVar13._12_4_ = extraout_XMM0_Dd;
  IVar6 = TransformerLogLog::operator()(this->Transformer,&local_60.Max);
  fVar9 = IVar6.x;
  fVar10 = IVar6.y;
  if (0xffffff < local_60.Color) {
    fVar11 = IVar5.x;
    fVar12 = IVar5.y;
    auVar4._8_4_ = extraout_XMM0_Dc_00;
    auVar4._0_4_ = IVar6.x;
    auVar4._4_4_ = IVar6.y;
    auVar4._12_4_ = extraout_XMM0_Dd_00;
    auVar13 = minps(auVar13,auVar4);
    local_38.Max = (ImVec2)(CONCAT44(~-(uint)(fVar10 <= fVar12) & (uint)fVar10,
                                     ~-(uint)(fVar9 <= fVar11) & (uint)fVar9) |
                           CONCAT44((uint)fVar12 & -(uint)(fVar10 <= fVar12),
                                    (uint)fVar11 & -(uint)(fVar9 <= fVar11)));
    local_38.Min = auVar13._0_8_;
    bVar7 = ImRect::Overlaps(cull_rect,&local_38);
    if (bVar7) {
      pIVar2 = DrawList->_VtxWritePtr;
      (pIVar2->pos).x = fVar11;
      (pIVar2->pos).y = fVar12;
      DrawList->_VtxWritePtr->uv = *uv;
      pIVar2 = DrawList->_VtxWritePtr;
      pIVar2->col = local_60.Color;
      pIVar2[1].pos.x = fVar11;
      pIVar2[1].pos.y = fVar10;
      pIVar2[1].uv = *uv;
      pIVar2 = DrawList->_VtxWritePtr;
      pIVar2[1].col = local_60.Color;
      pIVar2[2].pos.x = fVar9;
      pIVar2[2].pos.y = fVar10;
      DrawList->_VtxWritePtr[2].uv = *uv;
      pIVar2 = DrawList->_VtxWritePtr;
      pIVar2[2].col = local_60.Color;
      pIVar2[3].pos.x = fVar9;
      pIVar2[3].pos.y = fVar12;
      pIVar2[3].uv = *uv;
      pIVar2 = DrawList->_VtxWritePtr;
      pIVar2[3].col = local_60.Color;
      DrawList->_VtxWritePtr = pIVar2 + 4;
      uVar1 = DrawList->_VtxCurrentIdx;
      pIVar3 = DrawList->_IdxWritePtr;
      IVar8 = (ImDrawIdx)uVar1;
      *pIVar3 = IVar8;
      pIVar3[1] = IVar8 + 1;
      pIVar3[2] = IVar8 + 3;
      pIVar3[3] = IVar8 + 1;
      pIVar3[4] = IVar8 + 2;
      pIVar3[5] = IVar8 + 3;
      DrawList->_IdxWritePtr = pIVar3 + 6;
      DrawList->_VtxCurrentIdx = uVar1 + 4;
      return true;
    }
  }
  return false;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }